

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple.h
# Opt level: O3

void __thiscall Multiple_Simple_Test::TestBody(Multiple_Simple_Test *this)

{
  pointer *ppcVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar2;
  bool bVar3;
  char *pcVar4;
  undefined1 local_158 [8];
  BigNumber num_1;
  undefined1 local_120 [16];
  undefined1 local_110 [8];
  BigNumber num_2;
  BigNumber num_3;
  BigNumber num_4;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  BigNumber local_50;
  
  num_3._32_8_ = &num_4.m_digits;
  std::__cxx11::string::_M_construct<char_const*>((string *)&num_3.m_symbol,"1","");
  BigNumber::BigNumber((BigNumber *)local_110,(string *)&num_3.m_symbol);
  ppcVar1 = &local_50.m_digits.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_50._vptr_BigNumber = (_func_int **)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"1","");
  BigNumber::BigNumber((BigNumber *)&num_2.m_symbol,(string *)&local_50);
  BigNumber::operator*((BigNumber *)local_158,(BigNumber *)local_110,(BigNumber *)&num_2.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_2.m_symbol);
  if (local_50._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_50._vptr_BigNumber);
  }
  BigNumber::~BigNumber((BigNumber *)local_110);
  if ((vector<char,_std::allocator<char>_> *)num_3._32_8_ != &num_4.m_digits) {
    operator_delete((void *)num_3._32_8_);
  }
  local_50._vptr_BigNumber = (_func_int **)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"1","");
  BigNumber::BigNumber((BigNumber *)&num_2.m_symbol,(string *)&local_50);
  psVar2 = &gtest_ar.message_;
  local_78 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-1","");
  BigNumber::BigNumber((BigNumber *)&num_3.m_symbol,(string *)local_78);
  BigNumber::operator*
            ((BigNumber *)local_110,(BigNumber *)&num_2.m_symbol,(BigNumber *)&num_3.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_3.m_symbol);
  if (local_78 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_78);
  }
  BigNumber::~BigNumber((BigNumber *)&num_2.m_symbol);
  if (local_50._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_50._vptr_BigNumber);
  }
  local_78 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-1","");
  BigNumber::BigNumber((BigNumber *)&num_3.m_symbol,(string *)local_78);
  num_4._32_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&num_4.m_symbol,"1","");
  BigNumber::BigNumber(&local_50,(string *)&num_4.m_symbol);
  BigNumber::operator*((BigNumber *)&num_2.m_symbol,(BigNumber *)&num_3.m_symbol,&local_50);
  BigNumber::~BigNumber(&local_50);
  if ((undefined1 *)num_4._32_8_ != local_88) {
    operator_delete((void *)num_4._32_8_);
  }
  BigNumber::~BigNumber((BigNumber *)&num_3.m_symbol);
  if (local_78 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_78);
  }
  num_4._32_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&num_4.m_symbol,"-1","");
  BigNumber::BigNumber(&local_50,(string *)&num_4.m_symbol);
  num_1._32_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&num_1.m_symbol,"-1","");
  BigNumber::BigNumber((BigNumber *)local_78,(string *)&num_1.m_symbol);
  BigNumber::operator*((BigNumber *)&num_3.m_symbol,&local_50,(BigNumber *)local_78);
  BigNumber::~BigNumber((BigNumber *)local_78);
  if ((undefined1 *)num_1._32_8_ != local_120) {
    operator_delete((void *)num_1._32_8_);
  }
  BigNumber::~BigNumber(&local_50);
  if ((undefined1 *)num_4._32_8_ != local_88) {
    operator_delete((void *)num_4._32_8_);
  }
  BigNumber::toString_abi_cxx11_((string *)&local_50,(BigNumber *)local_158);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_78,"\"1\"","num_1.toString()",(char (*) [2])0x380c32,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
  if (local_50._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_50._vptr_BigNumber);
  }
  if (local_78[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_4.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/multiple.h"
               ,0x19,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_4.m_symbol,(Message *)&local_50)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_4.m_symbol);
    if (local_50._vptr_BigNumber != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_50._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_50._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_((string *)&local_50,(BigNumber *)local_110);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_78,"\"-1\"","num_2.toString()",(char (*) [3])0x380c31,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
  if (local_50._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_50._vptr_BigNumber);
  }
  if (local_78[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_4.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/multiple.h"
               ,0x1a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_4.m_symbol,(Message *)&local_50)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_4.m_symbol);
    if (local_50._vptr_BigNumber != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_50._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_50._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_((string *)&local_50,(BigNumber *)&num_2.m_symbol);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_78,"\"-1\"","num_3.toString()",(char (*) [3])0x380c31,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
  if (local_50._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_50._vptr_BigNumber);
  }
  if (local_78[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_4.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/multiple.h"
               ,0x1b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_4.m_symbol,(Message *)&local_50)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_4.m_symbol);
    if (local_50._vptr_BigNumber != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_50._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_50._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_((string *)&local_50,(BigNumber *)&num_3.m_symbol);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_78,"\"1\"","num_4.toString()",(char (*) [2])0x380c32,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
  if (local_50._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_50._vptr_BigNumber);
  }
  if (local_78[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_4.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/multiple.h"
               ,0x1c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_4.m_symbol,(Message *)&local_50)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_4.m_symbol);
    if (local_50._vptr_BigNumber != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_50._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_50._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::~BigNumber((BigNumber *)&num_3.m_symbol);
  BigNumber::~BigNumber((BigNumber *)&num_2.m_symbol);
  BigNumber::~BigNumber((BigNumber *)local_110);
  BigNumber::~BigNumber((BigNumber *)local_158);
  return;
}

Assistant:

TEST(Multiple, Simple)
{
    BigNumber num_1 = BigNumber("1") * BigNumber("1");
    BigNumber num_2 = BigNumber("1") * BigNumber("-1");
    BigNumber num_3 = BigNumber("-1") * BigNumber("1");
    BigNumber num_4 = BigNumber("-1") * BigNumber("-1");
    EXPECT_EQ("1", num_1.toString());
    EXPECT_EQ("-1", num_2.toString());
    EXPECT_EQ("-1", num_3.toString());
    EXPECT_EQ("1", num_4.toString());
}